

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

bool __thiscall leveldb::anon_unknown_0::LRUCache::FinishErase(LRUCache *this,LRUHandle *e)

{
  long lVar1;
  LRUHandle *pLVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (e != (LRUHandle *)0x0) {
    if (e->in_cache == false) {
      __assert_fail("e->in_cache",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                    ,0x135,"bool leveldb::(anonymous namespace)::LRUCache::FinishErase(LRUHandle *)"
                   );
    }
    pLVar2 = e->next;
    pLVar2->prev = e->prev;
    e->prev->next = pLVar2;
    e->in_cache = false;
    this->usage_ = this->usage_ - e->charge;
    Unref(this,e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return e != (LRUHandle *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool LRUCache::FinishErase(LRUHandle* e) {
  if (e != nullptr) {
    assert(e->in_cache);
    LRU_Remove(e);
    e->in_cache = false;
    usage_ -= e->charge;
    Unref(e);
  }
  return e != nullptr;
}